

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::
atomic_guarded<std::function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)>,std::mutex>
::store<std::function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)>const&>
          (atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
           *this,function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                 *newObj)

{
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> glock;
  mutex_type *in_stack_ffffffffffffffc8;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffe8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2bbd51);
  return;
}

Assistant:

void store(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
    }